

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O1

void __thiscall UnitTest_semantic18::Run(UnitTest_semantic18 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Terminator *pTVar2;
  pointer *__ptr;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> ast;
  _Head_base<0UL,_luna::SyntaxTree_*,_false> local_68;
  string local_60;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"while i == 1 do local i = 1 end","");
  anon_unknown.dwarf_2f225::Semantic((anon_unknown_dwarf_2f225 *)&local_68,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"i","");
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_60,local_40,local_40 + local_38);
  pTVar2 = ASTFind<luna::Terminator,FindName>
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      &local_68,(FindName *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  if (pTVar2->scoping_ != LexicalScoping_Global) {
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"\'i->scoping_ == luna::LexicalScoping_Global\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
  }
  if (local_68._M_head_impl != (SyntaxTree *)0x0) {
    (*(local_68._M_head_impl)->_vptr_SyntaxTree[1])();
  }
  return;
}

Assistant:

TEST_CASE(semantic18)
{
    auto ast = Semantic("while i == 1 do local i = 1 end");
    auto i = ASTFind<luna::Terminator>(ast, FindName("i"));
    EXPECT_TRUE(i->scoping_ == luna::LexicalScoping_Global);
}